

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alSourceQueueBuffers(void)

{
  uint32 name_00;
  ALsizei nb_00;
  uint32 uVar1;
  ALuint *origbufnames;
  ALuint *bufnames;
  int local_24c;
  ALsizei i;
  ALuint *names;
  ALuint *orignames;
  ALsizei nb;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&nb);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    nb_00 = IO_ALSIZEI();
    origbufnames = (ALuint *)IO_PTR();
    bufnames = (ALuint *)get_ioblob((long)nb_00 << 2);
    for (local_24c = 0; local_24c < nb_00; local_24c = local_24c + 1) {
      uVar1 = IO_UINT32();
      bufnames[local_24c] = uVar1;
    }
    if (io_failure == 0) {
      visit_alSourceQueueBuffers((CallerInfo *)&nb,name_00,nb_00,origbufnames,bufnames);
    }
  }
  return;
}

Assistant:

static void decode_alSourceQueueBuffers(void)
{
    IO_START(alSourceQueueBuffers);
    const ALuint name = IO_UINT32();
    const ALsizei nb = IO_ALSIZEI();
    ALuint *orignames = (ALuint *) IO_PTR();
    ALuint *names = (ALuint *) get_ioblob(sizeof (ALuint) * nb);
    ALsizei i;

    for (i = 0; i < nb; i++) {
        names[i] = IO_UINT32();
    }

    if (!io_failure) visit_alSourceQueueBuffers(&callerinfo, name, nb, orignames, names);

    IO_END();
}